

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O1

bool testing::internal::
     TypeParameterizedTest<(anonymous_namespace)::BitFieldAssignment,_testing::internal::TemplateSel<BitFieldAssignment_Assignment_Test>,_testing::internal::Types<(anonymous_namespace)::param<unsigned_char,_0U,_1U>,_(anonymous_namespace)::param<unsigned_char,_1U,_1U>,_(anonymous_namespace)::param<unsigned_char,_7U,_1U>,_(anonymous_namespace)::param<unsigned_short,_8U,_1U>,_(anonymous_namespace)::param<unsigned_short,_15U,_1U>,_(anonymous_namespace)::param<unsigned_int,_16U,_1U>,_(anonymous_namespace)::param<unsigned_int,_31U,_1U>,_(anonymous_namespace)::param<unsigned_long,_32U,_1U>,_(anonymous_namespace)::param<unsigned_long,_63U,_1U>,_(anonymous_namespace)::param<unsigned_char,_0U,_2U>,_(anonymous_namespace)::param<unsigned_char,_1U,_2U>,_(anonymous_namespace)::param<unsigned_char,_6U,_2U>,_(anonymous_namespace)::param<unsigned_short,_7U,_2U>,_(anonymous_namespace)::param<unsigned_short,_8U,_2U>,_(anonymous_namespace)::param<unsigned_short,_14U,_2U>,_(anonymous_namespace)::param<unsigned_int,_15U,_2U>,_(anonymous_namespace)::param<unsigned_int,_16U,_2U>,_(anonymous_namespace)::param<unsigned_long,_31U,_2U>,_(anonymous_namespace)::param<unsigned_long,_32U,_2U>,_(anonymous_namespace)::param<unsigned_long,_62U,_2U>,_(anonymous_namespace)::param<unsigned_char,_0U,_7U>,_(anonymous_namespace)::param<unsigned_char,_0U,_8U>,_(anonymous_namespace)::param<unsigned_short,_0U,_9U>,_(anonymous_namespace)::param<unsigned_short,_0U,_15U>,_(anonymous_namespace)::param<unsigned_short,_0U,_16U>,_(anonymous_namespace)::param<unsigned_int,_0U,_17U>,_(anonymous_namespace)::param<unsigned_int,_0U,_31U>,_(anonymous_namespace)::param<unsigned_int,_0U,_32U>,_(anonymous_namespace)::param<unsigned_long,_0U,_63U>,_(anonymous_namespace)::param<unsigned_long,_0U,_64U>_>_>
     ::Register(char *prefix,CodeLocation *code_location,char *case_name,char *test_names,int index,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *type_names)

{
  _Alloc_hider _Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  int iVar4;
  long *plVar5;
  size_t sVar6;
  TestFactoryBase *pTVar7;
  size_type *psVar8;
  long *plVar9;
  ulong *puVar10;
  type_info *extraout_RDX;
  type_info *extraout_RDX_00;
  type_info *extraout_RDX_01;
  type_info *extraout_RDX_02;
  type_info *extraout_RDX_03;
  type_info *extraout_RDX_04;
  type_info *extraout_RDX_05;
  type_info *extraout_RDX_06;
  type_info *extraout_RDX_07;
  type_info *extraout_RDX_08;
  type_info *extraout_RDX_09;
  type_info *ptVar11;
  char *extraout_RDX_10;
  char *extraout_RDX_11;
  char *extraout_RDX_12;
  char *extraout_RDX_13;
  char *extraout_RDX_14;
  char *extraout_RDX_15;
  char *extraout_RDX_16;
  char *extraout_RDX_17;
  char *extraout_RDX_18;
  char *extraout_RDX_19;
  undefined4 in_register_00000084;
  CodeLocation *code_location_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *type_names_00;
  ulong uVar12;
  char *pcVar13;
  undefined1 *puVar14;
  ulong *puVar15;
  char *pcVar16;
  long *local_298;
  long local_290;
  long local_288;
  long lStack_280;
  ulong *local_278;
  long local_270;
  ulong local_268;
  long lStack_260;
  GTestLog local_254;
  string local_250;
  CodeLocation local_230;
  string local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1e8;
  CodeLocation local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1b8;
  string local_1b0;
  CodeLocation *local_190;
  CodeLocation local_188;
  string local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_140;
  size_type local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  ulong *local_120;
  long local_118;
  undefined1 local_110;
  undefined7 uStack_10f;
  long lStack_108;
  CodeLocation local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d8;
  size_type local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  size_type local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  size_type local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  CodeLocation local_78;
  string local_50;
  
  local_298 = &local_288;
  local_190 = code_location;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_298,anon_var_dwarf_d47bc + 0x50,anon_var_dwarf_d47bc + 0x50,test_names
             ,CONCAT44(in_register_00000084,index));
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_298);
  local_100.file._M_dataplus._M_p = (pointer)&local_100.file.field_2;
  psVar8 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_100.file.field_2._M_allocated_capacity = *psVar8;
    local_100.file.field_2._8_8_ = plVar5[3];
  }
  else {
    local_100.file.field_2._M_allocated_capacity = *psVar8;
    local_100.file._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_100.file._M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_100);
  local_188.file._M_dataplus._M_p = (pointer)&local_188.file.field_2;
  psVar8 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_188.file.field_2._M_allocated_capacity = *psVar8;
    local_188.file.field_2._8_8_ = plVar5[3];
  }
  else {
    local_188.file.field_2._M_allocated_capacity = *psVar8;
    local_188.file._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_188.file._M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_188);
  local_1e0.file._M_dataplus._M_p = (pointer)&local_1e0.file.field_2;
  psVar8 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_1e0.file.field_2._M_allocated_capacity = *psVar8;
    local_1e0.file.field_2._8_8_ = plVar5[3];
  }
  else {
    local_1e0.file.field_2._M_allocated_capacity = *psVar8;
    local_1e0.file._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_1e0.file._M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_1e0,*(ulong *)(local_190->file)._M_dataplus._M_p);
  local_230.file._M_dataplus._M_p = (pointer)&local_230.file.field_2;
  psVar8 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_230.file.field_2._M_allocated_capacity = *psVar8;
    local_230.file.field_2._8_8_ = plVar5[3];
  }
  else {
    local_230.file.field_2._M_allocated_capacity = *psVar8;
    local_230.file._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_230.file._M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_1e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_230.file._M_dataplus._M_p;
  local_120 = (ulong *)&local_110;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"Assignment","");
  local_278 = local_120;
  ptVar11 = extraout_RDX;
  if (local_118 != 0) {
    puVar14 = (undefined1 *)((long)local_120 + local_118);
    do {
      puVar10 = local_120;
      iVar4 = isspace((uint)(byte)puVar14[-1]);
      local_278 = puVar10;
      ptVar11 = extraout_RDX_00;
      if (iVar4 == 0) break;
      puVar15 = (ulong *)(puVar14 + -1);
      uVar12 = (long)puVar15 - (long)puVar10;
      std::__cxx11::string::_M_erase((ulong)&local_120,uVar12);
      puVar14 = (undefined1 *)((long)local_120 + uVar12);
      local_278 = local_120;
      ptVar11 = extraout_RDX_01;
    } while (puVar15 != puVar10);
  }
  if (local_278 == (ulong *)&local_110) {
    lStack_260 = lStack_108;
    local_278 = &local_268;
  }
  puVar10 = local_278;
  local_268 = CONCAT71(uStack_10f,local_110);
  local_270 = local_118;
  local_118 = 0;
  local_110 = 0;
  local_120 = (ulong *)&local_110;
  GetTypeName_abi_cxx11_
            (&local_250,(internal *)&::(anonymous_namespace)::param<unsigned_char,0u,1u>::typeinfo,
             ptVar11);
  _Var1._M_p = local_250._M_dataplus._M_p;
  local_78.file._M_dataplus._M_p = (pointer)&local_78.file.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,*(long *)prefix,*(long *)(prefix + 8) + *(long *)prefix);
  iVar4 = *(int *)(prefix + 0x20);
  pcVar13 = *(char **)prefix;
  local_78.line = iVar4;
  bVar3 = IsTrue(true);
  if (!bVar3) {
    GTestLog::GTestLog((GTestLog *)&local_208,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/3rd_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x211);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
               ,0x6a);
    if (pcVar13 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x236748);
    }
    else {
      sVar6 = strlen(pcVar13);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar13,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
    std::ostream::operator<<((ostream *)&std::cerr,iVar4);
    GTestLog::~GTestLog((GTestLog *)&local_208);
  }
  pcVar13 = *(char **)prefix;
  iVar4 = *(int *)(prefix + 0x20);
  bVar3 = IsTrue(true);
  if (!bVar3) {
    GTestLog::GTestLog((GTestLog *)&local_208,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/3rd_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x226);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
               ,0x6f);
    if (pcVar13 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x236748);
    }
    else {
      sVar6 = strlen(pcVar13);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar13,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
    std::ostream::operator<<((ostream *)&std::cerr,iVar4);
    GTestLog::~GTestLog((GTestLog *)&local_208);
  }
  pTVar7 = (TestFactoryBase *)operator_new(8);
  pTVar7->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_00229498;
  MakeAndRegisterTestInfo
            (local_1e8->_M_local_buf,(char *)puVar10,_Var1._M_p,(char *)0x0,&local_78,
             &TypeIdHelper<(anonymous_namespace)::BitFieldAssignment<(anonymous_namespace)::param<unsigned_char,0u,1u>>>
              ::dummy_,(SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,pTVar7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.file._M_dataplus._M_p != &local_78.file.field_2) {
    operator_delete(local_78.file._M_dataplus._M_p,local_78.file.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  if (local_278 != &local_268) {
    operator_delete(local_278,local_268 + 1);
  }
  if (local_120 != (ulong *)&local_110) {
    operator_delete(local_120,CONCAT71(uStack_10f,local_110) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230.file._M_dataplus._M_p != &local_230.file.field_2) {
    operator_delete(local_230.file._M_dataplus._M_p,local_230.file.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0.file._M_dataplus._M_p != &local_1e0.file.field_2) {
    operator_delete(local_1e0.file._M_dataplus._M_p,local_1e0.file.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188.file._M_dataplus._M_p != &local_188.file.field_2) {
    operator_delete(local_188.file._M_dataplus._M_p,local_188.file.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.file._M_dataplus._M_p != &local_100.file.field_2) {
    operator_delete(local_100.file._M_dataplus._M_p,local_100.file.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_298 != &local_288) {
    operator_delete(local_298,local_288 + 1);
  }
  local_278 = &local_268;
  local_270 = 0;
  local_268 = local_268 & 0xffffffffffffff00;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_278);
  local_298 = &local_288;
  plVar9 = plVar5 + 2;
  if ((long *)*plVar5 == plVar9) {
    local_288 = *plVar9;
    lStack_280 = plVar5[3];
  }
  else {
    local_288 = *plVar9;
    local_298 = (long *)*plVar5;
  }
  local_290 = plVar5[1];
  *plVar5 = (long)plVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_298);
  local_188.file._M_dataplus._M_p = (pointer)&local_188.file.field_2;
  psVar8 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_188.file.field_2._M_allocated_capacity = *psVar8;
    local_188.file.field_2._8_8_ = plVar5[3];
  }
  else {
    local_188.file.field_2._M_allocated_capacity = *psVar8;
    local_188.file._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_188.file._M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_188);
  local_1e0.file._M_dataplus._M_p = (pointer)&local_1e0.file.field_2;
  psVar8 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_1e0.file.field_2._M_allocated_capacity = *psVar8;
    local_1e0.file.field_2._8_8_ = plVar5[3];
  }
  else {
    local_1e0.file.field_2._M_allocated_capacity = *psVar8;
    local_1e0.file._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_1e0.file._M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_1e0,
                              *(ulong *)((local_190->file)._M_dataplus._M_p + 0x20));
  local_230.file._M_dataplus._M_p = (pointer)&local_230.file.field_2;
  psVar8 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_230.file.field_2._M_allocated_capacity = *psVar8;
    local_230.file.field_2._8_8_ = plVar5[3];
  }
  else {
    local_230.file.field_2._M_allocated_capacity = *psVar8;
    local_230.file._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_230.file._M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_1e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_230.file._M_dataplus._M_p;
  local_d8 = &local_c8;
  local_c8._M_allocated_capacity = 0x656d6e6769737341;
  local_c8._8_2_ = 0x746e;
  local_d0 = 10;
  pcVar13 = local_c8._M_local_buf + 10;
  local_c8._M_local_buf[10] = '\0';
  do {
    paVar2 = local_d8;
    iVar4 = isspace((uint)(byte)pcVar13[-1]);
    local_250._M_dataplus._M_p = (pointer)paVar2;
    ptVar11 = extraout_RDX_02;
    if (iVar4 == 0) break;
    pcVar16 = pcVar13 + -1;
    uVar12 = (long)pcVar16 - (long)paVar2;
    std::__cxx11::string::_M_erase((ulong)&local_d8,uVar12);
    pcVar13 = local_d8->_M_local_buf + uVar12;
    local_250._M_dataplus._M_p = (pointer)local_d8;
    ptVar11 = extraout_RDX_03;
  } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)pcVar16 != paVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p == &local_c8) {
    local_250.field_2._8_8_ =
         CONCAT53(local_c8._11_5_,CONCAT12(local_c8._M_local_buf[10],local_c8._8_2_));
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  }
  local_250.field_2._M_allocated_capacity = local_c8._M_allocated_capacity;
  local_250._M_string_length = local_d0;
  local_d0 = 0;
  local_c8._M_allocated_capacity = local_c8._M_allocated_capacity & 0xffffffffffffff00;
  local_1b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_250._M_dataplus._M_p;
  local_d8 = &local_c8;
  GetTypeName_abi_cxx11_
            (&local_208,(internal *)&::(anonymous_namespace)::param<unsigned_char,1u,1u>::typeinfo,
             ptVar11);
  _Var1._M_p = local_208._M_dataplus._M_p;
  local_100.file._M_dataplus._M_p = (pointer)&local_100.file.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_100,*(long *)prefix,*(long *)(prefix + 8) + *(long *)prefix);
  iVar4 = *(int *)(prefix + 0x20);
  pcVar13 = *(char **)prefix;
  local_100.line = iVar4;
  bVar3 = IsTrue(true);
  if (!bVar3) {
    GTestLog::GTestLog((GTestLog *)&local_1b0,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/3rd_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x211);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
               ,0x6a);
    if (pcVar13 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x236748);
    }
    else {
      sVar6 = strlen(pcVar13);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar13,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
    std::ostream::operator<<((ostream *)&std::cerr,iVar4);
    GTestLog::~GTestLog((GTestLog *)&local_1b0);
  }
  pcVar13 = *(char **)prefix;
  iVar4 = *(int *)(prefix + 0x20);
  bVar3 = IsTrue(true);
  if (!bVar3) {
    GTestLog::GTestLog((GTestLog *)&local_1b0,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/3rd_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x226);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
               ,0x6f);
    if (pcVar13 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x236748);
    }
    else {
      sVar6 = strlen(pcVar13);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar13,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
    std::ostream::operator<<((ostream *)&std::cerr,iVar4);
    GTestLog::~GTestLog((GTestLog *)&local_1b0);
  }
  pTVar7 = (TestFactoryBase *)operator_new(8);
  pTVar7->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_00229558;
  MakeAndRegisterTestInfo
            (local_1e8->_M_local_buf,local_1b8->_M_local_buf,_Var1._M_p,(char *)0x0,&local_100,
             &TypeIdHelper<(anonymous_namespace)::BitFieldAssignment<(anonymous_namespace)::param<unsigned_char,1u,1u>>>
              ::dummy_,(SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,pTVar7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.file._M_dataplus._M_p != &local_100.file.field_2) {
    operator_delete(local_100.file._M_dataplus._M_p,local_100.file.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8,local_c8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230.file._M_dataplus._M_p != &local_230.file.field_2) {
    operator_delete(local_230.file._M_dataplus._M_p,local_230.file.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0.file._M_dataplus._M_p != &local_1e0.file.field_2) {
    operator_delete(local_1e0.file._M_dataplus._M_p,local_1e0.file.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188.file._M_dataplus._M_p != &local_188.file.field_2) {
    operator_delete(local_188.file._M_dataplus._M_p,local_188.file.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_298 != &local_288) {
    operator_delete(local_298,local_288 + 1);
  }
  if (local_278 != &local_268) {
    operator_delete(local_278,local_268 + 1);
  }
  local_250._M_string_length = 0;
  local_250.field_2._M_allocated_capacity =
       local_250.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_250);
  local_278 = &local_268;
  puVar10 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar10) {
    local_268 = *puVar10;
    lStack_260 = plVar5[3];
  }
  else {
    local_268 = *puVar10;
    local_278 = (ulong *)*plVar5;
  }
  local_270 = plVar5[1];
  *plVar5 = (long)puVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_278);
  local_298 = &local_288;
  plVar9 = plVar5 + 2;
  if ((long *)*plVar5 == plVar9) {
    local_288 = *plVar9;
    lStack_280 = plVar5[3];
  }
  else {
    local_288 = *plVar9;
    local_298 = (long *)*plVar5;
  }
  local_290 = plVar5[1];
  *plVar5 = (long)plVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_298);
  local_1e0.file._M_dataplus._M_p = (pointer)&local_1e0.file.field_2;
  psVar8 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_1e0.file.field_2._M_allocated_capacity = *psVar8;
    local_1e0.file.field_2._8_8_ = plVar5[3];
  }
  else {
    local_1e0.file.field_2._M_allocated_capacity = *psVar8;
    local_1e0.file._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_1e0.file._M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_1e0,
                              *(ulong *)((local_190->file)._M_dataplus._M_p + 0x40));
  local_230.file._M_dataplus._M_p = (pointer)&local_230.file.field_2;
  psVar8 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_230.file.field_2._M_allocated_capacity = *psVar8;
    local_230.file.field_2._8_8_ = plVar5[3];
  }
  else {
    local_230.file.field_2._M_allocated_capacity = *psVar8;
    local_230.file._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_230.file._M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_1e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_230.file._M_dataplus._M_p;
  local_b8 = &local_a8;
  local_a8._M_allocated_capacity = 0x656d6e6769737341;
  local_a8._8_2_ = 0x746e;
  local_b0 = 10;
  pcVar13 = local_a8._M_local_buf + 10;
  local_a8._M_local_buf[10] = '\0';
  do {
    paVar2 = local_b8;
    iVar4 = isspace((uint)(byte)pcVar13[-1]);
    local_208._M_dataplus._M_p = (pointer)paVar2;
    ptVar11 = extraout_RDX_04;
    if (iVar4 == 0) break;
    pcVar16 = pcVar13 + -1;
    uVar12 = (long)pcVar16 - (long)paVar2;
    std::__cxx11::string::_M_erase((ulong)&local_b8,uVar12);
    pcVar13 = local_b8->_M_local_buf + uVar12;
    local_208._M_dataplus._M_p = (pointer)local_b8;
    ptVar11 = extraout_RDX_05;
  } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)pcVar16 != paVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p == &local_a8) {
    local_208.field_2._8_8_ =
         CONCAT53(local_a8._11_5_,CONCAT12(local_a8._M_local_buf[10],local_a8._8_2_));
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  }
  local_208.field_2._M_allocated_capacity = local_a8._M_allocated_capacity;
  local_208._M_string_length = local_b0;
  local_b0 = 0;
  local_a8._M_allocated_capacity = local_a8._M_allocated_capacity & 0xffffffffffffff00;
  local_1b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p;
  local_b8 = &local_a8;
  GetTypeName_abi_cxx11_
            (&local_1b0,(internal *)&::(anonymous_namespace)::param<unsigned_char,7u,1u>::typeinfo,
             ptVar11);
  _Var1._M_p = local_1b0._M_dataplus._M_p;
  local_188.file._M_dataplus._M_p = (pointer)&local_188.file.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_188,*(long *)prefix,*(long *)(prefix + 8) + *(long *)prefix);
  iVar4 = *(int *)(prefix + 0x20);
  pcVar13 = *(char **)prefix;
  local_188.line = iVar4;
  bVar3 = IsTrue(true);
  if (!bVar3) {
    GTestLog::GTestLog((GTestLog *)&local_160,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/3rd_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x211);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
               ,0x6a);
    if (pcVar13 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x236748);
    }
    else {
      sVar6 = strlen(pcVar13);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar13,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
    std::ostream::operator<<((ostream *)&std::cerr,iVar4);
    GTestLog::~GTestLog((GTestLog *)&local_160);
  }
  pcVar13 = *(char **)prefix;
  iVar4 = *(int *)(prefix + 0x20);
  bVar3 = IsTrue(true);
  if (!bVar3) {
    GTestLog::GTestLog((GTestLog *)&local_160,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/3rd_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x226);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
               ,0x6f);
    if (pcVar13 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x236748);
    }
    else {
      sVar6 = strlen(pcVar13);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar13,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
    std::ostream::operator<<((ostream *)&std::cerr,iVar4);
    GTestLog::~GTestLog((GTestLog *)&local_160);
  }
  pTVar7 = (TestFactoryBase *)operator_new(8);
  pTVar7->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_00229618;
  MakeAndRegisterTestInfo
            (local_1e8->_M_local_buf,local_1b8->_M_local_buf,_Var1._M_p,(char *)0x0,&local_188,
             &TypeIdHelper<(anonymous_namespace)::BitFieldAssignment<(anonymous_namespace)::param<unsigned_char,7u,1u>>>
              ::dummy_,(SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,pTVar7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188.file._M_dataplus._M_p != &local_188.file.field_2) {
    operator_delete(local_188.file._M_dataplus._M_p,local_188.file.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,local_a8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230.file._M_dataplus._M_p != &local_230.file.field_2) {
    operator_delete(local_230.file._M_dataplus._M_p,local_230.file.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0.file._M_dataplus._M_p != &local_1e0.file.field_2) {
    operator_delete(local_1e0.file._M_dataplus._M_p,local_1e0.file.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_298 != &local_288) {
    operator_delete(local_298,local_288 + 1);
  }
  if (local_278 != &local_268) {
    operator_delete(local_278,local_268 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  local_208._M_string_length = 0;
  local_208.field_2._M_allocated_capacity =
       local_208.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_208);
  psVar8 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_250.field_2._M_allocated_capacity = *psVar8;
    local_250.field_2._8_8_ = plVar5[3];
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  }
  else {
    local_250.field_2._M_allocated_capacity = *psVar8;
    local_250._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_250._M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_250);
  local_278 = &local_268;
  puVar10 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar10) {
    local_268 = *puVar10;
    lStack_260 = plVar5[3];
  }
  else {
    local_268 = *puVar10;
    local_278 = (ulong *)*plVar5;
  }
  local_270 = plVar5[1];
  *plVar5 = (long)puVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_278);
  local_298 = &local_288;
  plVar9 = plVar5 + 2;
  if ((long *)*plVar5 == plVar9) {
    local_288 = *plVar9;
    lStack_280 = plVar5[3];
  }
  else {
    local_288 = *plVar9;
    local_298 = (long *)*plVar5;
  }
  local_290 = plVar5[1];
  *plVar5 = (long)plVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_298,
                              *(ulong *)((local_190->file)._M_dataplus._M_p + 0x60));
  local_230.file._M_dataplus._M_p = (pointer)&local_230.file.field_2;
  psVar8 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_230.file.field_2._M_allocated_capacity = *psVar8;
    local_230.file.field_2._8_8_ = plVar5[3];
  }
  else {
    local_230.file.field_2._M_allocated_capacity = *psVar8;
    local_230.file._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_230.file._M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_1e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_230.file._M_dataplus._M_p;
  local_98 = &local_88;
  local_88._M_allocated_capacity = 0x656d6e6769737341;
  local_88._8_2_ = 0x746e;
  local_90 = 10;
  pcVar13 = local_88._M_local_buf + 10;
  local_88._M_local_buf[10] = '\0';
  do {
    paVar2 = local_98;
    iVar4 = isspace((uint)(byte)pcVar13[-1]);
    local_1b0._M_dataplus._M_p = (pointer)paVar2;
    ptVar11 = extraout_RDX_06;
    if (iVar4 == 0) break;
    pcVar16 = pcVar13 + -1;
    uVar12 = (long)pcVar16 - (long)paVar2;
    std::__cxx11::string::_M_erase((ulong)&local_98,uVar12);
    pcVar13 = local_98->_M_local_buf + uVar12;
    local_1b0._M_dataplus._M_p = (pointer)local_98;
    ptVar11 = extraout_RDX_07;
  } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)pcVar16 != paVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p == &local_88) {
    local_1b0.field_2._8_8_ =
         CONCAT53(local_88._11_5_,CONCAT12(local_88._M_local_buf[10],local_88._8_2_));
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  }
  local_1b0.field_2._M_allocated_capacity = local_88._M_allocated_capacity;
  local_1b0._M_string_length = local_90;
  local_90 = 0;
  local_88._M_allocated_capacity = local_88._M_allocated_capacity & 0xffffffffffffff00;
  local_1b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b0._M_dataplus._M_p;
  local_98 = &local_88;
  GetTypeName_abi_cxx11_
            (&local_160,(internal *)&::(anonymous_namespace)::param<unsigned_short,8u,1u>::typeinfo,
             ptVar11);
  _Var1._M_p = local_160._M_dataplus._M_p;
  local_1e0.file._M_dataplus._M_p = (pointer)&local_1e0.file.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e0,*(long *)prefix,*(long *)(prefix + 8) + *(long *)prefix);
  iVar4 = *(int *)(prefix + 0x20);
  pcVar13 = *(char **)prefix;
  local_1e0.line = iVar4;
  bVar3 = IsTrue(true);
  if (!bVar3) {
    GTestLog::GTestLog((GTestLog *)&local_140,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/3rd_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x211);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
               ,0x6a);
    if (pcVar13 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x236748);
    }
    else {
      sVar6 = strlen(pcVar13);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar13,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
    std::ostream::operator<<((ostream *)&std::cerr,iVar4);
    GTestLog::~GTestLog((GTestLog *)&local_140);
  }
  pcVar13 = *(char **)prefix;
  iVar4 = *(int *)(prefix + 0x20);
  bVar3 = IsTrue(true);
  if (!bVar3) {
    GTestLog::GTestLog((GTestLog *)&local_140,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/3rd_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x226);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
               ,0x6f);
    if (pcVar13 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x236748);
    }
    else {
      sVar6 = strlen(pcVar13);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar13,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
    std::ostream::operator<<((ostream *)&std::cerr,iVar4);
    GTestLog::~GTestLog((GTestLog *)&local_140);
  }
  pTVar7 = (TestFactoryBase *)operator_new(8);
  pTVar7->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_002296d8;
  MakeAndRegisterTestInfo
            (local_1e8->_M_local_buf,local_1b8->_M_local_buf,_Var1._M_p,(char *)0x0,&local_1e0,
             &TypeIdHelper<(anonymous_namespace)::BitFieldAssignment<(anonymous_namespace)::param<unsigned_short,8u,1u>>>
              ::dummy_,(SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,pTVar7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0.file._M_dataplus._M_p != &local_1e0.file.field_2) {
    operator_delete(local_1e0.file._M_dataplus._M_p,local_1e0.file.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98,local_88._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230.file._M_dataplus._M_p != &local_230.file.field_2) {
    operator_delete(local_230.file._M_dataplus._M_p,local_230.file.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_298 != &local_288) {
    operator_delete(local_298,local_288 + 1);
  }
  if (local_278 != &local_268) {
    operator_delete(local_278,local_268 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  local_1b0._M_string_length = 0;
  local_1b0.field_2._M_allocated_capacity =
       local_1b0.field_2._M_allocated_capacity & 0xffffffffffffff00;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_1b0);
  psVar8 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_208.field_2._M_allocated_capacity = *psVar8;
    local_208.field_2._8_8_ = plVar5[3];
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  }
  else {
    local_208.field_2._M_allocated_capacity = *psVar8;
    local_208._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_208._M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_208);
  psVar8 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_250.field_2._M_allocated_capacity = *psVar8;
    local_250.field_2._8_8_ = plVar5[3];
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  }
  else {
    local_250.field_2._M_allocated_capacity = *psVar8;
    local_250._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_250._M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_250);
  local_278 = &local_268;
  puVar10 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar10) {
    local_268 = *puVar10;
    lStack_260 = plVar5[3];
  }
  else {
    local_268 = *puVar10;
    local_278 = (ulong *)*plVar5;
  }
  local_270 = plVar5[1];
  *plVar5 = (long)puVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_278,
                              *(ulong *)((local_190->file)._M_dataplus._M_p + 0x80));
  local_298 = &local_288;
  plVar9 = plVar5 + 2;
  if ((long *)*plVar5 == plVar9) {
    local_288 = *plVar9;
    lStack_280 = plVar5[3];
  }
  else {
    local_288 = *plVar9;
    local_298 = (long *)*plVar5;
  }
  local_290 = plVar5[1];
  *plVar5 = (long)plVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_1e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_298;
  local_130._M_allocated_capacity = 0x656d6e6769737341;
  local_130._8_2_ = 0x746e;
  local_138 = 10;
  pcVar13 = local_130._M_local_buf + 10;
  local_130._M_local_buf[10] = '\0';
  local_140 = &local_130;
  do {
    paVar2 = local_140;
    iVar4 = isspace((uint)(byte)pcVar13[-1]);
    local_160._M_dataplus._M_p = (pointer)paVar2;
    ptVar11 = extraout_RDX_08;
    if (iVar4 == 0) break;
    pcVar16 = pcVar13 + -1;
    uVar12 = (long)pcVar16 - (long)paVar2;
    std::__cxx11::string::_M_erase((ulong)&local_140,uVar12);
    pcVar13 = local_140->_M_local_buf + uVar12;
    local_160._M_dataplus._M_p = (pointer)local_140;
    ptVar11 = extraout_RDX_09;
  } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)pcVar16 != paVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p == &local_130) {
    local_160.field_2._8_8_ =
         CONCAT53(local_130._11_5_,CONCAT12(local_130._M_local_buf[10],local_130._8_2_));
    local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  }
  local_160.field_2._M_allocated_capacity = local_130._M_allocated_capacity;
  local_160._M_string_length = local_138;
  local_138 = 0;
  local_130._M_allocated_capacity = local_130._M_allocated_capacity & 0xffffffffffffff00;
  local_1b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160._M_dataplus._M_p;
  local_140 = &local_130;
  GetTypeName_abi_cxx11_
            (&local_50,(internal *)&::(anonymous_namespace)::param<unsigned_short,15u,1u>::typeinfo,
             ptVar11);
  _Var1._M_p = local_50._M_dataplus._M_p;
  local_230.file._M_dataplus._M_p = (pointer)&local_230.file.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_230,*(long *)prefix,*(long *)(prefix + 8) + *(long *)prefix);
  iVar4 = *(int *)(prefix + 0x20);
  pcVar13 = *(char **)prefix;
  local_230.line = iVar4;
  bVar3 = IsTrue(true);
  if (!bVar3) {
    GTestLog::GTestLog(&local_254,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/3rd_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x211);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
               ,0x6a);
    if (pcVar13 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x236748);
    }
    else {
      sVar6 = strlen(pcVar13);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar13,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
    std::ostream::operator<<((ostream *)&std::cerr,iVar4);
    GTestLog::~GTestLog(&local_254);
  }
  pcVar13 = *(char **)prefix;
  iVar4 = *(int *)(prefix + 0x20);
  bVar3 = IsTrue(true);
  if (!bVar3) {
    GTestLog::GTestLog(&local_254,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/3rd_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x226);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
               ,0x6f);
    if (pcVar13 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x236748);
    }
    else {
      sVar6 = strlen(pcVar13);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar13,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
    std::ostream::operator<<((ostream *)&std::cerr,iVar4);
    GTestLog::~GTestLog(&local_254);
  }
  pTVar7 = (TestFactoryBase *)operator_new(8);
  pTVar7->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_00229798;
  type_names_00 =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)&TypeIdHelper<(anonymous_namespace)::BitFieldAssignment<(anonymous_namespace)::param<unsigned_short,15u,1u>>>
           ::dummy_;
  code_location_00 = &local_230;
  pcVar16 = (char *)0x0;
  MakeAndRegisterTestInfo
            ((char *)local_1e8,local_1b8->_M_local_buf,_Var1._M_p,(char *)0x0,code_location_00,
             &TypeIdHelper<(anonymous_namespace)::BitFieldAssignment<(anonymous_namespace)::param<unsigned_short,15u,1u>>>
              ::dummy_,(SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,pTVar7);
  iVar4 = (int)code_location_00;
  pcVar13 = extraout_RDX_10;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230.file._M_dataplus._M_p != &local_230.file.field_2) {
    operator_delete(local_230.file._M_dataplus._M_p,local_230.file.field_2._M_allocated_capacity + 1
                   );
    pcVar13 = extraout_RDX_11;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    pcVar13 = extraout_RDX_12;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    pcVar13 = extraout_RDX_13;
  }
  if (local_140 != &local_130) {
    operator_delete(local_140,local_130._M_allocated_capacity + 1);
    pcVar13 = extraout_RDX_14;
  }
  if (local_298 != &local_288) {
    operator_delete(local_298,local_288 + 1);
    pcVar13 = extraout_RDX_15;
  }
  if (local_278 != &local_268) {
    operator_delete(local_278,local_268 + 1);
    pcVar13 = extraout_RDX_16;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    pcVar13 = extraout_RDX_17;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    pcVar13 = extraout_RDX_18;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
    pcVar13 = extraout_RDX_19;
  }
  bVar3 = TypeParameterizedTest<(anonymous_namespace)::BitFieldAssignment,_testing::internal::TemplateSel<BitFieldAssignment_Assignment_Test>,_testing::internal::Types<(anonymous_namespace)::param<unsigned_int,_16U,_1U>,_(anonymous_namespace)::param<unsigned_int,_31U,_1U>,_(anonymous_namespace)::param<unsigned_long,_32U,_1U>,_(anonymous_namespace)::param<unsigned_long,_63U,_1U>,_(anonymous_namespace)::param<unsigned_char,_0U,_2U>,_(anonymous_namespace)::param<unsigned_char,_1U,_2U>,_(anonymous_namespace)::param<unsigned_char,_6U,_2U>,_(anonymous_namespace)::param<unsigned_short,_7U,_2U>,_(anonymous_namespace)::param<unsigned_short,_8U,_2U>,_(anonymous_namespace)::param<unsigned_short,_14U,_2U>,_(anonymous_namespace)::param<unsigned_int,_15U,_2U>,_(anonymous_namespace)::param<unsigned_int,_16U,_2U>,_(anonymous_namespace)::param<unsigned_long,_31U,_2U>,_(anonymous_namespace)::param<unsigned_long,_32U,_2U>,_(anonymous_namespace)::param<unsigned_long,_62U,_2U>,_(anonymous_namespace)::param<unsigned_char,_0U,_7U>,_(anonymous_namespace)::param<unsigned_char,_0U,_8U>,_(anonymous_namespace)::param<unsigned_short,_0U,_9U>,_(anonymous_namespace)::param<unsigned_short,_0U,_15U>,_(anonymous_namespace)::param<unsigned_short,_0U,_16U>,_(anonymous_namespace)::param<unsigned_int,_0U,_17U>,_(anonymous_namespace)::param<unsigned_int,_0U,_31U>,_(anonymous_namespace)::param<unsigned_int,_0U,_32U>,_(anonymous_namespace)::param<unsigned_long,_0U,_63U>,_(anonymous_namespace)::param<unsigned_long,_0U,_64U>_>_>
          ::Register(prefix,local_190,pcVar13,pcVar16,iVar4,type_names_00);
  return bVar3;
}

Assistant:

static bool Register(const char* prefix, const CodeLocation& code_location,
                       const char* case_name, const char* test_names, int index,
                       const std::vector<std::string>& type_names =
                           GenerateNames<DefaultNameGenerator, Types>()) {
    typedef typename Types::Head Type;
    typedef Fixture<Type> FixtureClass;
    typedef typename GTEST_BIND_(TestSel, Type) TestClass;

    // First, registers the first type-parameterized test in the type
    // list.
    MakeAndRegisterTestInfo(
        (std::string(prefix) + (prefix[0] == '\0' ? "" : "/") + case_name +
         "/" + type_names[static_cast<size_t>(index)])
            .c_str(),
        StripTrailingSpaces(GetPrefixUntilComma(test_names)).c_str(),
        GetTypeName<Type>().c_str(),
        nullptr,  // No value parameter.
        code_location, GetTypeId<FixtureClass>(),
        SuiteApiResolver<TestClass>::GetSetUpCaseOrSuite(
            code_location.file.c_str(), code_location.line),
        SuiteApiResolver<TestClass>::GetTearDownCaseOrSuite(
            code_location.file.c_str(), code_location.line),
        new TestFactoryImpl<TestClass>);

    // Next, recurses (at compile time) with the tail of the type list.
    return TypeParameterizedTest<Fixture, TestSel,
                                 typename Types::Tail>::Register(prefix,
                                                                 code_location,
                                                                 case_name,
                                                                 test_names,
                                                                 index + 1,
                                                                 type_names);
  }